

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_calc_tile_rows(long *tlpixel,long *tfpixel,int ndim,long *trowsize,long *ntrows,int *status
                       )

{
  ulong in_RAX;
  ulong uVar1;
  long lVar2;
  
  if (*status == 0) {
    *trowsize = 0;
    *ntrows = 1;
    in_RAX = 0;
    uVar1 = (ulong)(uint)ndim;
    if (ndim < 1) {
      uVar1 = in_RAX;
    }
    for (; uVar1 != in_RAX; in_RAX = in_RAX + 1) {
      if (0 < tlpixel[in_RAX] - tfpixel[in_RAX]) {
        lVar2 = (tlpixel[in_RAX] - tfpixel[in_RAX]) + 1;
        if (*trowsize == 0) {
          *trowsize = lVar2;
        }
        else {
          *ntrows = lVar2 * *ntrows;
        }
      }
    }
    if (*trowsize == 0) {
      *trowsize = 1;
      return (int)in_RAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

int fits_calc_tile_rows(long *tlpixel, long *tfpixel, int ndim, long *trowsize, long *ntrows, int *status)
{

   /*  The quantizing algorithms treat all N-dimensional tiles as if they
       were 2 dimensions (trowsize * ntrows).  This sets trowsize to the
       first dimensional size encountered that's > 1 (typically the X dimension).
       ntrows will then be the product of the remaining dimensional sizes.
       
       Examples:  Tile = (5,4,1,3):  trowsize=5, ntrows=12
                  Tile = (1,1,5):  trowsize=5, ntrows=1
   */

   int ii;
   long np;
   
   if (*status)
      return (*status);
    
   *trowsize = 0; 
   *ntrows = 1;  
   for (ii=0; ii<ndim; ++ii)
   {
      np = tlpixel[ii] - tfpixel[ii] + 1;
      if (np > 1)
      {
         if (!(*trowsize))
            *trowsize = np;
         else
            *ntrows *= np;
      }
   }
   if (!(*trowsize))
   {
      /* Should only get here for the unusual case of all tile dimensions 
         having size = 1  */
      *trowsize = 1;
   }  
      
   return (*status);
}